

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall TimerTest_simultaneousTimers_Test::TestBody(TimerTest_simultaneousTimers_Test *this)

{
  char *pcVar1;
  bool test_finished;
  int timers_running;
  unique_lock<std::mutex> lock;
  int local_a8;
  undefined4 uStack_a4;
  AssertHelper local_a0 [8];
  timer timer_obj;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  mutex notifier_mutex;
  condition_variable notifier;
  
  std::condition_variable::condition_variable(&notifier);
  notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  notifier_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  notifier_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  timers_running = 0;
  notifier_mutex.super___mutex_base._M_mutex.__align = 0;
  notifier_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  test_finished = false;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = operator_new(0x20);
  *(condition_variable **)local_88._M_unused._0_8_ = &notifier;
  *(mutex **)((long)local_88._M_unused._0_8_ + 8) = &notifier_mutex;
  *(int **)((long)local_88._M_unused._0_8_ + 0x10) = &timers_running;
  *(bool **)((long)local_88._M_unused._0_8_ + 0x18) = &test_finished;
  pcStack_70 = std::
               _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:154:26)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:154:26)>
             ::_M_manager;
  jessilib::timer::timer(&timer_obj,1000000);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  lock._M_device = (mutex_type *)0x6052340;
  std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&lock);
  local_a8 = 2;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&lock,"timers_running","2",&timers_running,&local_a8);
  if ((char)lock._M_device == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if (lock._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)lock._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0xad,pcVar1);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)CONCAT44(uStack_a4,local_a8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_a4,local_a8) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&lock._M_owns);
  std::unique_lock<std::mutex>::unique_lock(&lock,&notifier_mutex);
  test_finished = true;
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  std::condition_variable::notify_all();
  jessilib::timer::cancel();
  std::unique_lock<std::mutex>::unique_lock(&lock,&notifier_mutex);
  while (timers_running != 0) {
    std::condition_variable::wait((unique_lock *)&notifier);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&timer_obj.m_context.
              super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::condition_variable::~condition_variable(&notifier);
  return;
}

Assistant:

TEST(TimerTest, simultaneousTimers) {
	std::condition_variable notifier;
	std::mutex notifier_mutex;
	int timers_running = 0;
	bool test_finished = false;

	// Spin up timer
	timer timer_obj{period, [&notifier, &notifier_mutex, &timers_running, &test_finished]([[maybe_unused]] timer& in_timer) {
		std::unique_lock<std::mutex> lock(notifier_mutex);
		if (test_finished) {
			notifier.notify_all();
			return;
		}

		++timers_running;

		// Wait for a few more timer periods to pass before proceeding
		notifier.wait(lock);

		// We're done here; cancel
		--timers_running;
		notifier.notify_all();
	}};

	// Wait for some timers to fire
	std::this_thread::sleep_for(period + 100ms);
	EXPECT_GE(timers_running, 2);

	// Notify timers to close
	{
		std::unique_lock<std::mutex> lock(notifier_mutex);
		test_finished = true;
	}
	notifier.notify_all();

	// Wait for timers to complete
	timer_obj.cancel();
	std::unique_lock<std::mutex> lock(notifier_mutex);
	notifier.wait(lock, [&timers_running]() {
		return timers_running == 0;
	});
}